

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aAccuracyTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Accuracy::TextureTests::init(TextureTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TextureTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureFilteringTests::TextureFilteringTests
            ((TextureFilteringTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureMipmapTests::TextureMipmapTests
            ((TextureMipmapTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new TextureFilteringTests	(m_context));
		addChild(new TextureMipmapTests		(m_context));
	}